

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSearchBasedMethod.cpp
# Opt level: O3

Type __thiscall
QuantLib::LineSearchBasedMethod::minimize
          (LineSearchBasedMethod *this,Problem *P,EndCriteria *endCriteria,RealType initialStepSize)

{
  DynamicVector<double,_std::allocator<double>_> *__x;
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pdVar3;
  Type TVar4;
  bool bVar5;
  pointer pdVar6;
  LineSearch *pLVar7;
  size_type __n;
  size_t iteration;
  RealType extraout_XMM0_Qa;
  RealType RVar8;
  RealType extraout_XMM0_Qa_00;
  double dVar9;
  Type ecType;
  DynamicVector<double,_std::allocator<double>_> tmp;
  DynamicVector<double,_std::allocator<double>_> prevGradient;
  DynamicVector<double,_std::allocator<double>_> x_;
  DynamicVector<double,_std::allocator<double>_> d;
  size_t maxStationaryStateIterations_;
  Type local_11c;
  DynamicVector<double,_std::allocator<double>_> local_118;
  undefined1 local_f8 [16];
  pointer local_e8;
  DynamicVector<double,_std::allocator<double>_> local_d8;
  vector<double,_std::allocator<double>_> local_b8;
  RealType local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<double,_std::allocator<double>_> local_80;
  RealType *local_68;
  RealType local_60;
  RealType local_58;
  size_t local_50;
  RealType local_48;
  undefined8 uStack_40;
  
  local_a0 = initialStepSize;
  local_60 = EndCriteria::functionEpsilon(endCriteria);
  local_50 = EndCriteria::maxStationaryStateIterations(endCriteria);
  local_11c = None;
  P->functionValue_ = 0.0;
  P->squaredNorm_ = 0.0;
  P->functionEvaluation_ = 0;
  P->gradientEvaluation_ = 0;
  __x = &P->currentValue_;
  std::vector<double,_std::allocator<double>_>::vector(&local_98,&__x->data_);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,
             (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_80);
  pLVar7 = this->lineSearch_;
  pdVar6 = (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_f8._0_8_;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_f8._8_8_;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_e8;
  local_f8 = (undefined1  [16])0x0;
  local_e8 = (pointer)0x0;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar3 - (long)pdVar6);
    if ((pointer)local_f8._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
    }
  }
  __n = (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->lineSearch_->searchDirection_).data_.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start >> 3;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_f8,__n,(allocator_type *)&local_80);
  std::vector<double,_std::allocator<double>_>::vector(&local_80,__n,(allocator_type *)&local_b8);
  std::vector<double,_std::allocator<double>_>::vector(&local_b8,__n,(allocator_type *)&local_d8);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_d8.data_,__n,(allocator_type *)&local_118);
  uVar1 = P->functionEvaluation_;
  uVar2 = P->gradientEvaluation_;
  P->functionEvaluation_ = uVar1 + 1;
  P->gradientEvaluation_ = uVar2 + 1;
  (*P->objectiveFunction_->_vptr_ObjectiveFunction[4])(P->objectiveFunction_,local_f8,&local_98);
  P->functionValue_ = extraout_XMM0_Qa;
  (*P->statusFunction_->_vptr_StatusFunction[2])
            (P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
             (ulong)(uint)P->gradientEvaluation_,__x);
  RVar8 = Problem::DotProduct(P,(DynamicVector<double,_std::allocator<double>_> *)local_f8,
                              (DynamicVector<double,_std::allocator<double>_> *)local_f8);
  P->squaredNorm_ = RVar8;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_118.data_,(vector<double,_std::allocator<double>_> *)local_f8);
  for (pdVar6 = local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar6 != local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
    *pdVar6 = -*pdVar6;
  }
  pLVar7 = this->lineSearch_;
  pdVar6 = (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar3 = (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pLVar7->searchDirection_).data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pdVar6 != (pointer)0x0) {
    operator_delete(pdVar6,(long)pdVar3 - (long)pdVar6);
    if (local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_68 = &P->functionValue_;
  bVar5 = true;
  iteration = 0;
  while( true ) {
    local_48 = P->functionValue_;
    uStack_40 = 0;
    local_58 = P->squaredNorm_;
    pLVar7 = this->lineSearch_;
    if (!bVar5) {
      std::vector<double,_std::allocator<double>_>::operator=
                ((vector<double,_std::allocator<double>_> *)local_f8,&(pLVar7->gradient_).data_);
      pLVar7 = this->lineSearch_;
    }
    (*pLVar7->_vptr_LineSearch[2])(local_a0,pLVar7,P,&local_11c,endCriteria);
    if (this->lineSearch_->succeed_ != true) {
      std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_98);
      (*P->statusFunction_->_vptr_StatusFunction[2])
                (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
                 (ulong)(uint)P->gradientEvaluation_,__x);
      goto LAB_001f4290;
    }
    local_a0 = extraout_XMM0_Qa_00;
    std::vector<double,_std::allocator<double>_>::operator=
              (&local_98,&(this->lineSearch_->xtd_).data_);
    std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_98);
    (*P->statusFunction_->_vptr_StatusFunction[2])
              (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
               (ulong)(uint)P->gradientEvaluation_,__x);
    RVar8 = this->lineSearch_->qpt_;
    P->functionValue_ = this->lineSearch_->qt_;
    P->squaredNorm_ = RVar8;
    (*(this->super_OptimizationMethod)._vptr_OptimizationMethod[3])
              (local_58,&local_118,this,P,local_f8);
    pdVar3 = local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar6 = local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pdVar6 != (pointer)0x0) {
      operator_delete(pdVar6,(long)pdVar3 - (long)pdVar6);
      if (local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    OpenMD::operator-(&local_118,&local_d8,&this->lineSearch_->searchDirection_);
    pdVar3 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar6 = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (pdVar6 != (pointer)0x0) {
      operator_delete(pdVar6,(long)pdVar3 - (long)pdVar6);
      if (local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.data_.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->lineSearch_->searchDirection_).data_,&local_d8.data_);
    dVar9 = ABS(*local_68 - local_48);
    if (((dVar9 + dVar9) / (ABS(local_48) + ABS(*local_68) + 2.220446049250313e-16) < local_60) ||
       (bVar5 = EndCriteria::checkMaxIterations(endCriteria,iteration,&local_11c), bVar5)) break;
    std::vector<double,_std::allocator<double>_>::operator=(&__x->data_,&local_98);
    (*P->statusFunction_->_vptr_StatusFunction[2])
              (P->functionValue_,P->statusFunction_,(ulong)(uint)P->functionEvaluation_,
               (ulong)(uint)P->gradientEvaluation_,__x);
    iteration = iteration + 1;
    bVar5 = false;
  }
  EndCriteria::checkStationaryFunctionValue(endCriteria,0.0,0.0,&local_50,&local_11c);
  EndCriteria::checkMaxIterations(endCriteria,iteration,&local_11c);
LAB_001f4290:
  TVar4 = local_11c;
  if (local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_f8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_f8._0_8_,(long)local_e8 - local_f8._0_8_);
  }
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return TVar4;
}

Assistant:

EndCriteria::Type LineSearchBasedMethod::minimize(
      Problem& P, const EndCriteria& endCriteria,
      RealType initialStepSize = 1.0) {
    // Initializations
    RealType ftol = endCriteria.functionEpsilon();
    size_t maxStationaryStateIterations_ =
        endCriteria.maxStationaryStateIterations();
    EndCriteria::Type ecType = EndCriteria::None;   // reset end criteria
    P.reset();                                      // reset problem
    DynamicVector<RealType> x_ = P.currentValue();  // store the starting point
    size_t iterationNumber_    = 0;
    // dimension line search
    lineSearch_->searchDirection() = DynamicVector<RealType>(x_.size());
    bool done                      = false;

    // function and squared norm of gradient values;
    RealType fnew, fold, gold2;
    RealType fdiff;
    // classical initial value for line-search step
    // RealType t = 1.0;
    // new initial value for line-search step
    RealType t = initialStepSize;
    // Set gradient g at the size of the optimization problem
    // search direction
    size_t sz = lineSearch_->searchDirection().size();
    DynamicVector<RealType> prevGradient(sz), d(sz), sddiff(sz), direction(sz);
    // Initialize objective function, gradient prevGradient and
    // search direction

    P.setFunctionValue(P.valueAndGradient(prevGradient, x_));
    P.setGradientNormValue(P.DotProduct(prevGradient, prevGradient));
    lineSearch_->searchDirection() = -prevGradient;

    bool first_time = true;
    // Loop over iterations
    do {
      fold  = P.functionValue();
      gold2 = P.gradientNormValue();

      // Linesearch
      if (!first_time) prevGradient = lineSearch_->lastGradient();

      t = (*lineSearch_)(P, ecType, endCriteria, t);

      // don't throw: it can fail just because maxIterations exceeded
      // QL_REQUIRE(lineSearch_->succeed(), "line-search failed!");
      if (lineSearch_->succeed()) {
        // Updates
        // New point
        x_ = lineSearch_->lastX();
        P.setCurrentValue(x_);
        // New function value
        P.setFunctionValue(lineSearch_->lastFunctionValue());
        // New gradient and search direction vectors

        // orthogonalization coef
        P.setGradientNormValue(lineSearch_->lastGradientNorm2());

        // conjugate gradient search direction
        direction = getUpdatedDirection(P, gold2, prevGradient);

        sddiff = direction - lineSearch_->searchDirection();

        lineSearch_->searchDirection() = direction;
        // Now compute accuracy and check end criteria
        // Numerical Recipes exit strategy on fx (see NR in C++, p.423)

        fnew  = P.functionValue();
        fdiff = 2.0 * std::fabs(fnew - fold) /
                (std::fabs(fnew) + std::fabs(fold) +
                 std::numeric_limits<RealType>::epsilon());

        if (fdiff < ftol ||
            endCriteria.checkMaxIterations(iterationNumber_, ecType)) {
          endCriteria.checkStationaryFunctionValue(
              0.0, 0.0, maxStationaryStateIterations_, ecType);
          endCriteria.checkMaxIterations(iterationNumber_, ecType);
          return ecType;
        }
        P.setCurrentValue(x_);  // update problem current value
        ++iterationNumber_;     // Increase iteration number
        first_time = false;
      } else {
        done = true;
      }
    } while (!done);
    P.setCurrentValue(x_);
    return ecType;
  }